

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_common.c
# Opt level: O2

void * tree_node_next(void *Node)

{
  void *pvVar1;
  tree_node *node;
  bool bVar2;
  
  if (*(void **)((long)Node + 0x20) != (void *)0x0) {
    pvVar1 = tree_node_min(*(void **)((long)Node + 0x20));
    return pvVar1;
  }
  do {
    pvVar1 = *(void **)((long)Node + 0x10);
    if (pvVar1 == (void *)0x0) {
      return (void *)0x0;
    }
    bVar2 = *(void **)((long)pvVar1 + 0x20) == Node;
    Node = pvVar1;
  } while (bVar2);
  return pvVar1;
}

Assistant:

void*
tree_node_next(void* Node)
{
    tree_node* node = Node;
    if (node->rlink)
	return tree_node_min(node->rlink);
    tree_node* parent = node->parent;
    while (parent && parent->rlink == node) {
	node = parent;
	parent = parent->parent;
    }
    return parent;
}